

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PcaModel.hpp
# Opt level: O1

VectorXf __thiscall
eos::morphablemodel::PcaModel::draw_sample
          (PcaModel *this,vector<float,_std::allocator<float>_> *coefficients)

{
  pointer size;
  vector<float,_std::allocator<float>_> *in_RDX;
  Index extraout_RDX;
  ActualDstType actualDst;
  ulong __new_size;
  VectorXf VVar1;
  assign_op<float,_float> local_49;
  undefined1 local_48 [24];
  pointer local_30;
  
  __new_size = (ulong)*(int *)&coefficients[2].super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)(in_RDX->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(in_RDX->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 2) < __new_size) {
    std::vector<float,_std::allocator<float>_>::resize(in_RDX,__new_size);
  }
  local_48._16_8_ =
       (in_RDX->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  local_30 = (pointer)((long)(in_RDX->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                             super__Vector_impl_data._M_finish - local_48._16_8_ >> 2);
  if ((long)local_30 < 0) {
    __assert_fail("vecSize >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/MapBase.h"
                  ,0xa6,
                  "Eigen::MapBase<Eigen::Map<Eigen::Matrix<float, -1, 1>>, 0>::MapBase(PointerType, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, 1>>, Level = 0]"
                 );
  }
  if (coefficients[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != local_30) {
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Product.h"
                  ,0x62,
                  "Eigen::Product<Eigen::Matrix<float, -1, -1>, Eigen::Map<Eigen::Matrix<float, -1, 1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<float, -1, -1>, Rhs = Eigen::Map<Eigen::Matrix<float, -1, 1>>, Option = 0]"
                 );
  }
  local_48._8_8_ =
       &coefficients[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  size = coefficients[2].super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_start;
  local_48._0_8_ = coefficients;
  if ((coefficients->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
      super__Vector_impl_data._M_finish == size) {
    (this->mean).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (float *)0x0;
    (this->mean).super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    if (-1 < (long)size) {
      Eigen::DenseStorage<float,_-1,_-1,_1,_0>::resize
                ((DenseStorage<float,__1,__1,_1,_0> *)this,(Index)size,(Index)size,1);
      Eigen::internal::
      assignment_from_xpr_op_product<Eigen::Matrix<float,-1,1,0,-1,1>,Eigen::Matrix<float,-1,1,0,-1,1>,Eigen::Product<Eigen::Matrix<float,-1,-1,0,-1,-1>,Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>,0>,Eigen::internal::assign_op<float,float>,Eigen::internal::add_assign_op<float,float>>
      ::
      run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::Matrix<float,_1,1,0,_1,1>const,Eigen::Product<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,0>const>,Eigen::internal::assign_op<float,float>>
                (&this->mean,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                  *)local_48,&local_49);
      VVar1.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           extraout_RDX;
      VVar1.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (float *)this;
      return (VectorXf)VVar1.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage
      ;
    }
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/PlainObjectBase.h"
                  ,0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<float, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<float, -1, 1>]"
                 );
  }
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/CwiseBinaryOp.h"
                ,0x74,
                "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::Matrix<float, -1, 1>, const Eigen::Product<Eigen::Matrix<float, -1, -1>, Eigen::Map<Eigen::Matrix<float, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<float>, Lhs = const Eigen::Matrix<float, -1, 1>, Rhs = const Eigen::Product<Eigen::Matrix<float, -1, -1>, Eigen::Map<Eigen::Matrix<float, -1, 1>>>]"
               );
}

Assistant:

Eigen::VectorXf draw_sample(std::vector<float> coefficients) const
    {
        // Fill the rest with zeros if not all coefficients are given:
        if (coefficients.size() < get_num_principal_components())
        {
            coefficients.resize(get_num_principal_components());
        }
        const Eigen::Map<Eigen::VectorXf> alphas(coefficients.data(), coefficients.size());

        const Eigen::VectorXf model_sample = mean + rescaled_pca_basis * alphas;

        return model_sample;
    }